

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json_encode_test.c
# Opt level: O2

int main(int argc,char **argv)

{
  _Bool _Var1;
  byte bVar2;
  
  if (argc < 2) {
LAB_00101534:
    bVar2 = 1;
    _Var1 = uo_json_encode_number_test();
    if (!_Var1) goto LAB_00101549;
LAB_0010153f:
    _Var1 = uo_json_encode_utf8_test();
  }
  else {
    if (*argv[1] == 'u') goto LAB_0010153f;
    if (*argv[1] != 'n') goto LAB_00101534;
    _Var1 = uo_json_encode_number_test();
  }
  bVar2 = _Var1 ^ 1;
LAB_00101549:
  return (int)bVar2;
}

Assistant:

int main(
    int argc, 
    char const **argv)
{
    char test = argc > 1
        ? argv[1][0]
        : '\0';

    switch (test)
    {
        case 'n': return uo_json_encode_number_test() ? 0 : 1;
        case 'u': return uo_json_encode_utf8_test() ? 0 : 1;
        default: return uo_json_encode_number_test()
            && uo_json_encode_utf8_test() ? 0 : 1;
    }
}